

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

bool __thiscall QToolButton::event(QToolButton *this,QEvent *event)

{
  QToolButtonPrivate *this_00;
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  QHoverEvent *he;
  ulong uVar5;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ushort *)(event + 8) - 0x7f < 3) {
    this_00 = *(QToolButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
    uVar2 = QEventPoint::position();
    auVar7._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar7._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar7 = minpd(_DAT_0066f5d0,auVar7);
    auVar6._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
    auVar6._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
    uVar3 = movmskpd(uVar2,auVar6);
    uVar5 = 0x8000000000000000;
    if ((uVar3 & 1) != 0) {
      uVar5 = (ulong)(uint)(int)auVar7._0_8_ << 0x20;
    }
    uVar4 = 0x80000000;
    if ((uVar3 & 2) != 0) {
      uVar4 = (ulong)(uint)(int)auVar7._8_8_;
    }
    local_28 = (QPoint)(uVar4 | uVar5);
    QToolButtonPrivate::updateHoverControl(this_00,&local_28);
  }
  bVar1 = QAbstractButton::event(&this->super_QAbstractButton,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QToolButton::event(QEvent *event)
{
    switch(event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d_func()->updateHoverControl(he->position().toPoint());
        break;
    default:
        break;
    }
    return QAbstractButton::event(event);
}